

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

void on_underlying_io_bytes_received(void *context,uchar *buffer,size_t size)

{
  byte bVar1;
  ushort uVar2;
  byte *pbVar3;
  _Bool _Var4;
  int iVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int *piVar9;
  LOGGER_LOG p_Var10;
  BUFFER_HANDLE pBVar11;
  uchar *buffer_00;
  size_t sVar12;
  char cVar13;
  bool bVar14;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  undefined8 uVar18;
  size_t sVar19;
  char *pcVar20;
  undefined4 uVar21;
  ushort *puVar22;
  byte *needed_bytes;
  char *__nptr;
  byte *pbVar23;
  ushort *utf8_str;
  bool bVar24;
  uint16_t close_code;
  char *next;
  ulong in_stack_ffffffffffffff98;
  ushort local_52;
  void *local_50;
  uchar *local_48;
  BUFFER_HANDLE local_40;
  char *local_38;
  
  if (context == (void *)0x0) {
    return;
  }
  if (buffer == (uchar *)0x0 || size == 0) {
    xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
    *(undefined4 *)((long)context + 0x40) = 0;
    uVar18 = 9;
  }
  else {
    iVar5 = *(int *)((long)context + 0x40);
    if (iVar5 - 3U < 2) {
      uVar16 = *(ulong *)((long)context + 0xa8);
      sVar19 = uVar16 + 1 + size;
      if (0xfffffffffffffffd < uVar16 + size) {
        sVar19 = 0xffffffffffffffff;
      }
      if ((size ^ 0xffffffffffffffff) <= uVar16) {
        sVar19 = 0xffffffffffffffff;
      }
      *(size_t *)((long)context + 0xa0) = sVar19;
      if ((sVar19 != 0xffffffffffffffff) &&
         (pvVar7 = realloc(*(void **)((long)context + 0x98),sVar19), pvVar7 != (void *)0x0)) {
LAB_0013b76e:
        *(void **)((long)context + 0x98) = pvVar7;
        lVar6 = *(long *)((long)context + 0xa8);
        local_50 = memcpy((void *)((long)pvVar7 + lVar6),buffer,size);
        *(size_t *)((long)context + 0xa8) = lVar6 + size;
        do {
          iVar5 = *(int *)((long)context + 0x40);
          bVar24 = true;
          if (1 < iVar5 - 3U) {
            if (iVar5 != 2) {
              if (iVar5 != 1) goto LAB_0013c30c;
              xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
              *(undefined4 *)((long)context + 0x40) = 0;
              goto LAB_0013b7e0;
            }
            *(undefined1 *)(*(long *)((long)context + 0x98) + *(long *)((long)context + 0xa8)) = 0;
            if (3 < *(ulong *)((long)context + 0xa8)) {
              pcVar20 = *(char **)((long)context + 0x98);
              pcVar8 = strstr(pcVar20,"\r\n\r\n");
              if (pcVar8 != (char *)0x0) {
                if (pcVar20 == (char *)0x0) {
LAB_0013bbac:
                  bVar14 = false;
                  pvVar7 = local_50;
                }
                else {
                  __nptr = pcVar20 + 5;
                  cVar13 = 'H';
                  lVar6 = 0;
                  do {
                    if (cVar13 != pcVar20[lVar6]) {
                      __nptr = pcVar20 + lVar6;
                      bVar14 = true;
                      goto LAB_0013ba80;
                    }
                    cVar13 = *(char *)((long)&ParseHttpResponse_HTTPPrefix + lVar6 + 1);
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 5);
                  bVar14 = false;
LAB_0013ba80:
                  if (!bVar14) {
                    for (; *__nptr != '\0'; __nptr = __nptr + 1) {
                      if (*__nptr == '.') goto LAB_0013bb90;
                    }
                    bVar14 = true;
                  }
LAB_0013bb90:
                  if (!bVar14) {
                    for (; *__nptr != '\0'; __nptr = __nptr + 1) {
                      if (*__nptr == ' ') goto LAB_0013bba8;
                    }
                    bVar14 = true;
                  }
LAB_0013bba8:
                  if (bVar14) goto LAB_0013bbac;
                  bVar14 = false;
                  pvVar7 = (void *)strtol(__nptr,&local_38,0);
                  if (local_38 != __nptr) {
                    if (((int)pvVar7 + 0x80000001U < 2) &&
                       (piVar9 = __errno_location(), *piVar9 != 0)) {
                      bVar14 = false;
                    }
                    else {
                      bVar14 = true;
                    }
                  }
                }
                local_50 = pvVar7;
                if (bVar14) {
                  if ((int)pvVar7 == 0x65) {
                    pvVar7 = *(void **)((long)context + 0x98);
                    pcVar8 = pcVar8 + (4 - (long)pvVar7);
                    sVar19 = (long)*(char **)((long)context + 0xa8) - (long)pcVar8;
                    if (pcVar8 <= *(char **)((long)context + 0xa8) && sVar19 != 0) {
                      memmove(pvVar7,(char *)((long)pvVar7 + (long)pcVar8),sVar19);
                    }
                    *(long *)((long)context + 0xa8) = *(long *)((long)context + 0xa8) - (long)pcVar8
                    ;
                    *(undefined4 *)((long)context + 0x40) = 3;
                    (**(code **)((long)context + 0x48))();
                    bVar24 = false;
                    goto LAB_0013c30c;
                  }
                  p_Var10 = xlogging_get_log_function();
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    in_stack_ffffffffffffff98 =
                         CONCAT44((int)(in_stack_ffffffffffffff98 >> 0x20),(int)local_50);
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                               ,"on_underlying_io_bytes_received",0x4b6,1,
                               "Bad status (%d) received in WebSocket Upgrade response",
                               in_stack_ffffffffffffff98);
                  }
                  xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0
                           );
                  *(undefined4 *)((long)context + 0x40) = 0;
                }
                else {
                  p_Var10 = xlogging_get_log_function();
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                               ,"on_underlying_io_bytes_received",0x4b0,1,
                               "Cannot decode HTTP response");
                  }
                  xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0
                           );
                  *(undefined4 *)((long)context + 0x40) = 0;
                }
LAB_0013b7e0:
                (**(code **)((long)context + 0x48))();
              }
            }
            goto LAB_0013c30c;
          }
          if ((*(ulong *)((long)context + 0xa8) < 2) || (*(ulong *)((long)context + 0xa0) < 2))
          goto LAB_0013c30c;
          if (*(char *)(*(long *)((long)context + 0x98) + 1) < '\0') {
            p_Var10 = xlogging_get_log_function();
            if (p_Var10 != (LOGGER_LOG)0x0) {
              (*p_Var10)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                         ,"on_underlying_io_bytes_received",0x4df,1,
                         "Masked frame detected by WebSocket client");
            }
            *(undefined4 *)((long)context + 0x40) = 7;
            send_close_frame((UWS_CLIENT_INSTANCE *)context,0x3ea);
            (**(code **)((long)context + 0x78))();
          }
          lVar6 = *(long *)((long)context + 0x98);
          bVar1 = *(byte *)(lVar6 + 1);
          pbVar17 = (byte *)(ulong)bVar1;
          if (bVar1 == 0x7f) {
            needed_bytes = (byte *)0xa;
            pbVar17 = (byte *)0x7f;
            bVar14 = true;
            if (9 < *(ulong *)((long)context + 0xa8)) {
              if ((*(ulong *)((long)context + 0xa0) < 3) || ((long)*(char *)(lVar6 + 2) < 0)) {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  iVar5 = 0x509;
                  pcVar20 = "Bad frame: received a 64 bit length frame with the highest bit set";
LAB_0013bacd:
                  (*p_Var10)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                             ,"on_underlying_io_bytes_received",iVar5,1,pcVar20);
                }
              }
              else if (9 < *(ulong *)((long)context + 0xa0)) {
                uVar16 = (ulong)*(byte *)(lVar6 + 8) << 8 |
                         (ulong)*(byte *)(lVar6 + 7) << 0x10 |
                         (ulong)*(byte *)(lVar6 + 6) << 0x18 |
                         (ulong)*(byte *)(lVar6 + 5) << 0x20 |
                         (ulong)*(byte *)(lVar6 + 4) << 0x28 |
                         (ulong)*(byte *)(lVar6 + 3) << 0x30 | (long)*(char *)(lVar6 + 2) << 0x38;
                pbVar17 = (byte *)(uVar16 + *(byte *)(lVar6 + 9));
                needed_bytes = pbVar17 + 10;
                if ((byte *)0xfffffffffffffff5 < pbVar17) {
                  needed_bytes = (byte *)0xffffffffffffffff;
                }
                bVar14 = needed_bytes != (byte *)0xffffffffffffffff &&
                         (*(byte *)(lVar6 + 9) + uVar16) - 0x10000 < 0x7ffffffffffeffff;
                if (bVar14) goto LAB_0013baea;
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 & 0xffffffff00000000;
                  iVar5 = 0x528;
                  pcVar20 = "Bad frame: received a %u length on the 64 bit length";
                  goto LAB_0013bacd;
                }
              }
LAB_0013bad2:
              *(undefined4 *)((long)context + 0x40) = 7;
              (**(code **)((long)context + 0x78))();
              bVar14 = false;
            }
          }
          else if (bVar1 == 0x7e) {
            needed_bytes = (byte *)0x4;
            pbVar17 = (byte *)0x7e;
            bVar14 = true;
            if ((3 < *(ulong *)((long)context + 0xa8)) && (3 < *(ulong *)((long)context + 0xa0))) {
              pbVar17 = (byte *)(ulong)CONCAT11(*(undefined1 *)(lVar6 + 2),
                                                *(undefined1 *)(lVar6 + 3));
              if (pbVar17 < (byte *)0x7e) {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  in_stack_ffffffffffffff98 = in_stack_ffffffffffffff98 & 0xffffffff00000000;
                  iVar5 = 0x4f5;
                  pcVar20 = "Bad frame: received a %u length on the 16 bit length";
                  goto LAB_0013bacd;
                }
                goto LAB_0013bad2;
              }
              needed_bytes = pbVar17 + 4;
            }
          }
          else {
            needed_bytes = pbVar17 + 2;
            bVar14 = true;
          }
LAB_0013baea:
          if ((!bVar14) || (*(byte **)((long)context + 0xa8) < needed_bytes)) goto LAB_0013c30c;
          pbVar3 = *(byte **)((long)context + 0x98);
          bVar1 = *pbVar3;
          bVar24 = false;
          switch(bVar1 & 0xf) {
          case 0:
            iVar5 = process_frame_fragment
                              ((UWS_CLIENT_INSTANCE *)context,(size_t)pbVar17,(size_t)needed_bytes);
            bVar24 = iVar5 == 0;
            if (((char)bVar1 < '\0') && (iVar5 == 0)) {
              if (*(char *)((long)context + 0xc0) == '\0') {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  iVar5 = 0x552;
                  pcVar20 = 
                  "Continuation fragment received without initial fragment specifying frame data type"
                  ;
LAB_0013bd7a:
                  (*p_Var10)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                             ,"on_underlying_io_bytes_received",iVar5,1,pcVar20);
                }
LAB_0013bd7f:
                *(undefined4 *)((long)context + 0x40) = 7;
                (**(code **)((long)context + 0x78))();
              }
              else {
                (**(code **)((long)context + 0x58))
                          (*(undefined8 *)((long)context + 0x60),*(char *)((long)context + 0xc0),
                           *(undefined8 *)((long)context + 0xb0),
                           *(undefined8 *)((long)context + 0xb8));
                *(undefined8 *)((long)context + 0xb8) = 0;
                *(undefined1 *)((long)context + 0xc0) = 0;
              }
              goto LAB_0013bfe3;
            }
            break;
          case 1:
            if ((char)bVar1 < '\0') {
              (**(code **)((long)context + 0x58))
                        (*(undefined8 *)((long)context + 0x60),1,
                         (long)(pbVar3 + (long)needed_bytes) - (long)pbVar17,pbVar17);
            }
            else {
              if (*(char *)((long)context + 0xc0) != '\0') {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  iVar5 = 0x571;
LAB_0013bd6d:
                  pcVar20 = 
                  "Fragmented frame received interleaved between the fragments of another message";
                  goto LAB_0013bd7a;
                }
                goto LAB_0013bd7f;
              }
              iVar5 = process_frame_fragment
                                ((UWS_CLIENT_INSTANCE *)context,(size_t)pbVar17,(size_t)needed_bytes
                                );
              if (iVar5 != 0) goto LAB_0013c2d8;
              *(undefined1 *)((long)context + 0xc0) = 1;
            }
            goto LAB_0013bfe3;
          case 2:
            if ((char)bVar1 < '\0') {
              pbVar23 = pbVar3 + (long)needed_bytes;
              if (CARRY8((ulong)pbVar3,(ulong)needed_bytes)) {
                pbVar23 = (byte *)0xffffffffffffffff;
              }
              lVar6 = (long)pbVar23 - (long)pbVar17;
              if (lVar6 == -1 || pbVar23 < pbVar17) {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  in_stack_ffffffffffffff98 = 0xffffffffffffffff;
                  (*p_Var10)(AZ_LOG_ERROR,
                             "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                             ,"on_underlying_io_bytes_received",0x59a,1,
                             "Invalid packet length, stream_buffer_idx=%zu",0xffffffffffffffff);
                }
                *(undefined4 *)((long)context + 0x40) = 7;
                (**(code **)((long)context + 0x78))();
                bVar24 = true;
              }
              else {
                (**(code **)((long)context + 0x58))
                          (*(undefined8 *)((long)context + 0x60),2,lVar6,pbVar17);
                bVar24 = false;
              }
              if (lVar6 == -1 || pbVar23 < pbVar17) break;
            }
            else {
              if (*(char *)((long)context + 0xc0) != '\0') {
                p_Var10 = xlogging_get_log_function();
                if (p_Var10 != (LOGGER_LOG)0x0) {
                  iVar5 = 0x5a5;
                  goto LAB_0013bd6d;
                }
                goto LAB_0013bd7f;
              }
              iVar5 = process_frame_fragment
                                ((UWS_CLIENT_INSTANCE *)context,(size_t)pbVar17,(size_t)needed_bytes
                                );
              if (iVar5 != 0) goto LAB_0013c2d8;
              *(undefined1 *)((long)context + 0xc0) = 2;
            }
LAB_0013bfe3:
            bVar24 = true;
            break;
          case 8:
            if ((char)bVar1 < '\0') {
              if (pbVar17 < (byte *)0x2) {
                puVar22 = (ushort *)0x0;
              }
              else {
                uVar2 = *(ushort *)(pbVar3 + (long)needed_bytes + -(long)pbVar17);
                local_52 = uVar2 << 8 | uVar2 >> 8;
                puVar22 = &local_52;
              }
              if (pbVar17 < (byte *)0x3) {
                bVar24 = false;
LAB_0013c0c7:
                pbVar17 = (byte *)0x0;
                utf8_str = (ushort *)0x0;
              }
              else {
                utf8_str = (ushort *)((long)(pbVar3 + (long)needed_bytes + -(long)pbVar17) + 2);
                pbVar17 = pbVar17 + -2;
                _Var4 = utf8_checker_is_valid_utf8((uchar *)utf8_str,(size_t)pbVar17);
                if (!_Var4) {
                  p_Var10 = xlogging_get_log_function();
                  bVar24 = true;
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                               ,"on_underlying_io_bytes_received",0x5e9,1,
                               "Reason in CLOSE frame is not UTF-8.");
                  }
                  goto LAB_0013c0c7;
                }
                bVar24 = false;
              }
              if (bVar24) {
                *(undefined4 *)((long)context + 0x40) = 6;
                iVar5 = xio_close(*(XIO_HANDLE *)((long)context + 8),on_underlying_io_close_complete
                                  ,context);
                if (iVar5 != 0) {
                  p_Var10 = xlogging_get_log_function();
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                               ,"on_underlying_io_bytes_received",0x5fa,1,
                               "Could not close underlying IO");
                  }
LAB_0013c2ab:
                  *(undefined4 *)((long)context + 0x40) = 7;
                  (**(code **)((long)context + 0x78))(*(undefined8 *)((long)context + 0x80),5);
                  *(undefined4 *)((long)context + 0x40) = 0;
                }
              }
              else {
                uVar21 = 5;
                if (*(int *)((long)context + 0x40) == 4) {
                  *(undefined4 *)((long)context + 0x40) = 6;
                  iVar5 = xio_close(*(XIO_HANDLE *)((long)context + 8),
                                    on_underlying_io_close_complete,context);
                  if (iVar5 != 0) {
                    *(undefined4 *)((long)context + 0x40) = 0;
                    uVar21 = 0;
                    if (*(code **)((long)context + 0x88) != (code *)0x0) {
                      (**(code **)((long)context + 0x88))(*(undefined8 *)((long)context + 0x90));
                    }
                    goto LAB_0013c179;
                  }
                }
                else {
LAB_0013c179:
                  *(undefined4 *)((long)context + 0x40) = uVar21;
                }
                pBVar11 = uws_frame_encoder_encode(WS_CLOSE_FRAME,(uchar *)0x0,0,true,true,'\0');
                if (pBVar11 == (BUFFER_HANDLE)0x0) {
                  p_Var10 = xlogging_get_log_function();
                  if (p_Var10 != (LOGGER_LOG)0x0) {
                    (*p_Var10)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                               ,"on_underlying_io_bytes_received",0x61a,1,
                               "Cannot encode the response CLOSE frame");
                  }
                  *(undefined4 *)((long)context + 0x40) = 6;
                  iVar5 = xio_close(*(XIO_HANDLE *)((long)context + 8),
                                    on_underlying_io_close_complete,context);
                  if (iVar5 != 0) goto LAB_0013c2ab;
                }
                else {
                  local_48 = BUFFER_u_char(pBVar11);
                  local_40 = pBVar11;
                  sVar12 = BUFFER_length(pBVar11);
                  iVar5 = xio_send(*(XIO_HANDLE *)((long)context + 8),local_48,sVar12,
                                   on_underlying_io_close_sent,context);
                  if (iVar5 != 0) {
                    p_Var10 = xlogging_get_log_function();
                    if (p_Var10 != (LOGGER_LOG)0x0) {
                      (*p_Var10)(AZ_LOG_ERROR,
                                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                                 ,"on_underlying_io_bytes_received",0x62b,1,
                                 "Cannot send the response CLOSE frame");
                    }
                    *(undefined4 *)((long)context + 0x40) = 6;
                    iVar5 = xio_close(*(XIO_HANDLE *)((long)context + 8),
                                      on_underlying_io_close_complete,context);
                    if (iVar5 != 0) {
                      *(undefined4 *)((long)context + 0x40) = 7;
                      (**(code **)((long)context + 0x78))(*(undefined8 *)((long)context + 0x80),5);
                      *(undefined4 *)((long)context + 0x40) = 0;
                    }
                  }
                  BUFFER_delete(local_40);
                }
              }
              (**(code **)((long)context + 0x68))
                        (*(undefined8 *)((long)context + 0x70),puVar22,utf8_str,pbVar17);
            }
            else {
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 != (LOGGER_LOG)0x0) {
                iVar5 = 0x5cb;
LAB_0013bdf2:
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                           ,"on_underlying_io_bytes_received",iVar5,1,
                           "Fragmented control frame received.");
              }
LAB_0013be04:
              *(undefined4 *)((long)context + 0x40) = 7;
              (**(code **)((long)context + 0x78))();
            }
            goto LAB_0013c2d8;
          case 9:
            if (-1 < (char)bVar1) {
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 != (LOGGER_LOG)0x0) {
                iVar5 = 0x650;
                goto LAB_0013bdf2;
              }
              goto LAB_0013be04;
            }
            pBVar11 = uws_frame_encoder_encode
                                (WS_PONG_FRAME,pbVar3 + (long)needed_bytes + -(long)pbVar17,
                                 (size_t)pbVar17,true,true,'\0');
            if (pBVar11 == (BUFFER_HANDLE)0x0) {
              p_Var10 = xlogging_get_log_function();
              if (p_Var10 != (LOGGER_LOG)0x0) {
                bVar24 = false;
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                           ,"on_underlying_io_bytes_received",0x659,1,"Encoding of PONG failed.");
                break;
              }
            }
            else {
              buffer_00 = BUFFER_u_char(pBVar11);
              sVar12 = BUFFER_length(pBVar11);
              iVar5 = xio_send(*(XIO_HANDLE *)((long)context + 8),buffer_00,sVar12,
                               unchecked_on_send_complete,(void *)0x0);
              if ((iVar5 != 0) &&
                 (p_Var10 = xlogging_get_log_function(), p_Var10 != (LOGGER_LOG)0x0)) {
                (*p_Var10)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                           ,"on_underlying_io_bytes_received",0x662,1,"Sending PONG frame failed.");
              }
              BUFFER_delete(pBVar11);
            }
LAB_0013c2d8:
            bVar24 = false;
          }
          sVar19 = (long)*(byte **)((long)context + 0xa8) - (long)needed_bytes;
          if (needed_bytes <= *(byte **)((long)context + 0xa8) && sVar19 != 0) {
            memmove(*(void **)((long)context + 0x98),
                    (byte *)((long)*(void **)((long)context + 0x98) + (long)needed_bytes),sVar19);
          }
          *(long *)((long)context + 0xa8) = *(long *)((long)context + 0xa8) - (long)needed_bytes;
          bVar24 = !bVar24;
LAB_0013c30c:
          if (bVar24) {
            return;
          }
        } while( true );
      }
      p_Var10 = xlogging_get_log_function();
      if (p_Var10 != (LOGGER_LOG)0x0) {
        (*p_Var10)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/uws_client.c"
                   ,"on_underlying_io_bytes_received",0x479,1,
                   "Cannot allocate memory for received data");
      }
      *(undefined4 *)((long)context + 0x40) = 7;
      uVar18 = 1;
      lVar6 = 0x80;
      lVar15 = 0x78;
      goto LAB_0013b62f;
    }
    if (iVar5 == 2) {
      uVar16 = *(ulong *)((long)context + 0xa8);
      sVar19 = uVar16 + 1 + size;
      if (0xfffffffffffffffd < uVar16 + size) {
        sVar19 = 0xffffffffffffffff;
      }
      if ((size ^ 0xffffffffffffffff) <= uVar16) {
        sVar19 = 0xffffffffffffffff;
      }
      *(size_t *)((long)context + 0xa0) = sVar19;
      if ((sVar19 != 0xffffffffffffffff) &&
         (pvVar7 = realloc(*(void **)((long)context + 0x98),sVar19), pvVar7 != (void *)0x0))
      goto LAB_0013b76e;
      xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      *(undefined4 *)((long)context + 0x40) = 0;
      uVar18 = 4;
    }
    else {
      if (iVar5 != 1) {
        return;
      }
      xio_close(*(XIO_HANDLE *)((long)context + 8),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      *(undefined4 *)((long)context + 0x40) = 0;
      uVar18 = 10;
    }
  }
  lVar6 = 0x50;
  lVar15 = 0x48;
LAB_0013b62f:
  (**(code **)((long)context + lVar15))(*(undefined8 *)((long)context + lVar6),uVar18);
  return;
}

Assistant:

static void on_underlying_io_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)context;

    /* Codes_SRS_SASLCLIENTIO_01_028: [If `buffer` is NULL or `size` is zero, nothing should be indicated as received, the state shall be switched to ERROR and the `on_io_error` callback shall be triggered.]*/
    if ((buffer == NULL) ||
        (size == 0))
    {
        LogError("Bad buffer received from the underlying IO, buffer = %p, size = %u",
            buffer, (unsigned int)size);
        handle_error(sasl_client_io_instance);
    }
    else
    {
        switch (sasl_client_io_instance->io_state)
        {
        default:
            break;

        case IO_STATE_OPEN:
            /* Codes_SRS_SASLCLIENTIO_01_027: [When the `on_underlying_io_bytes_received` callback passed to the underlying IO is called and the SASL client IO state is `IO_STATE_OPEN`, the bytes shall be indicated to the user of SASL client IO by calling the `on_bytes_received` callback that was passed in `saslclientio_open`.]*/
            /* Codes_SRS_SASLCLIENTIO_01_029: [The `context` argument for `on_io_error` shall be set to the `on_io_error_context` passed in `saslclientio_open`.]*/
            sasl_client_io_instance->on_bytes_received(sasl_client_io_instance->on_bytes_received_context, buffer, size);
            break;

        case IO_STATE_SASL_HANDSHAKE:
        {
            size_t i;

            /* Codes_SRS_SASLCLIENTIO_01_030: [If bytes are received when the SASL client IO state is `IO_STATE_OPENING`, the bytes shall be consumed by the SASL client IO to satisfy the SASL handshake.]*/
            for (i = 0; i < size; i++)
            {
                if (saslclientio_receive_byte(sasl_client_io_instance, buffer[i]) != 0)
                {
                    break;
                }
            }

            if (i < size)
            {
                /* Codes_SRS_SASLCLIENTIO_01_073: [If the handshake fails (i.e. the outcome is an error) the `on_io_open_complete` callback shall be triggered with `IO_OPEN_ERROR`.]*/
                handle_error(sasl_client_io_instance);
            }

            break;
        }

        case IO_STATE_ERROR:
            /* Codes_SRS_SASLCLIENTIO_01_031: [If bytes are received when the SASL client IO state is `IO_STATE_ERROR`, SASL client IO shall do nothing.]*/
            break;
        }
    }
}